

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

string * Catch::StringMaker<double,void>::convert_abi_cxx11_(double value)

{
  string *in_RDI;
  int in_stack_00000074;
  double in_stack_00000078;
  
  Detail::anon_unknown_3::fpToString<double>(in_stack_00000078,in_stack_00000074);
  return in_RDI;
}

Assistant:

std::string StringMaker<double>::convert(double value) {
    return Detail::fpToString(value, precision);
}